

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O2

int main(void)

{
  size_t n;
  ulong n_00;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  sizes sVar8;
  sizes sVar9;
  sizes sVar10;
  sizes sVar11;
  size_t local_40;
  size_t local_38;
  
  for (n_00 = 10; n_00 < 0x989681; n_00 = n_00 * 2) {
    printf("%-10zu ",n_00);
    sVar8 = fuse16(n_00);
    sVar9 = fuse8(n_00);
    sVar10 = xor16(n_00);
    sVar11 = xor8(n_00);
    dVar1 = (double)(long)n_00;
    auVar4._8_4_ = sVar8.pack._4_4_;
    auVar4._0_8_ = sVar8.pack;
    auVar4._12_4_ = 0x45300000;
    printf("fuse16: %5.2f %5.2f   ",((double)(long)sVar8.standard * 8.0) / dVar1,
           (((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar8.pack) - 4503599627370496.0)) * 8.0) / dVar1);
    auVar5._8_4_ = sVar9.pack._4_4_;
    auVar5._0_8_ = sVar9.pack;
    auVar5._12_4_ = 0x45300000;
    printf("fuse8: %5.2f %5.2f   ",((double)(long)sVar9.standard * 8.0) / dVar1,
           (((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar9.pack) - 4503599627370496.0)) * 8.0) / dVar1);
    auVar2._8_4_ = sVar10.standard._4_4_;
    auVar2._0_8_ = sVar10.standard;
    auVar2._12_4_ = 0x45300000;
    auVar6._8_4_ = sVar10.pack._4_4_;
    auVar6._0_8_ = sVar10.pack;
    auVar6._12_4_ = 0x45300000;
    printf("xor16: %5.2f %5.2f   ",
           (((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar10.standard) - 4503599627370496.0)) * 8.0) / dVar1
           ,(((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar10.pack) - 4503599627370496.0)) * 8.0) / dVar1);
    local_40 = sVar11.standard;
    auVar3._8_4_ = sVar11.standard._4_4_;
    auVar3._0_8_ = local_40;
    auVar3._12_4_ = 0x45300000;
    local_38 = sVar11.pack;
    auVar7._8_4_ = sVar11.pack._4_4_;
    auVar7._0_8_ = local_38;
    auVar7._12_4_ = 0x45300000;
    printf("xor8: %5.2f %5.2f   ",
           (((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar11.standard) - 4503599627370496.0)) * 8.0) / dVar1
           ,(((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar11.pack) - 4503599627370496.0)) * 8.0) / dVar1);
    putchar(10);
  }
  return 0;
}

Assistant:

int main() {
    for (size_t n = 10; n <= 10000000; n *= 2) {
        printf("%-10zu ", n);  // Align number to 10 characters wide
        sizes f16 = fuse16(n);
        sizes f8 = fuse8(n);
        sizes x16 = xor16(n);
        sizes x8 = xor8(n);
        
        printf("fuse16: %5.2f %5.2f   ", (double)f16.standard * 8.0 / n, (double)f16.pack * 8.0 / n);
        printf("fuse8: %5.2f %5.2f   ", (double)f8.standard  * 8.0 / n, (double)f8.pack  * 8.0 / n);
        printf("xor16: %5.2f %5.2f   ", (double)x16.standard  * 8.0 / n, (double)x16.pack  * 8.0 / n);
        printf("xor8: %5.2f %5.2f   ", (double)x8.standard  * 8.0 / n, (double)x8.pack  * 8.0 / n);
        printf("\n");
    }
    return EXIT_SUCCESS;
}